

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entries.hpp
# Opt level: O1

size_t binlog::serializeSizePrefixedTagged<binlog::WriterProp,binlog::detail::VectorOutputStream>
                 (WriterProp *entry,VectorOutputStream *out)

{
  long lVar1;
  size_t (*__range2) [4];
  uint uVar2;
  long lVar3;
  long lVar4;
  size_t field_sizes [4];
  ulong local_48 [5];
  
  local_48[0] = 0;
  local_48[1] = 8;
  local_48[2] = (entry->name)._M_string_length + 4;
  local_48[3] = 8;
  lVar3 = 0;
  lVar4 = 0;
  lVar1 = 0;
  do {
    lVar3 = lVar3 + local_48[lVar1];
    lVar4 = lVar4 + local_48[lVar1 + 1];
    lVar1 = lVar1 + 2;
  } while (lVar1 != 4);
  uVar2 = (int)lVar4 + (int)lVar3 + 8;
  local_48[0] = (ulong)uVar2;
  std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
            ((vector<char,std::allocator<char>> *)out,
             (out->vector).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish,local_48);
  local_48[0] = 0xfffffffffffffffe;
  std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
            ((vector<char,std::allocator<char>> *)out,
             (out->vector).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish,local_48,local_48 + 1);
  mserialize::
  StructSerializer<binlog::WriterProp,_std::integral_constant<unsigned_long_binlog::WriterProp::*,_&binlog::WriterProp::id>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::WriterProp::*,_&binlog::WriterProp::name>,_std::integral_constant<unsigned_long_binlog::WriterProp::*,_&binlog::WriterProp::batchSize>_>
  ::serialize<binlog::detail::VectorOutputStream>(entry,out);
  return (ulong)uVar2 + 4;
}

Assistant:

std::size_t serializeSizePrefixedTagged(const Entry& entry, OutputStream& out)
{
  const std::uint64_t tag = Entry::Tag;
  const std::uint32_t size = std::uint32_t(mserialize::serialized_size(entry) + sizeof(tag));
  mserialize::serialize(size, out);
  mserialize::serialize(tag, out);
  mserialize::serialize(entry, out);

  return size + sizeof(size);
}